

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::ClassNamePrefix
                   (string *__return_storage_ptr__,string *classname)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  long lVar4;
  string lower;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)classname);
  for (sVar3 = 0; local_40._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar2 = tolower((int)local_40._M_dataplus._M_p[sVar3]);
    local_40._M_dataplus._M_p[sVar3] = (char)iVar2;
  }
  lVar4 = 0;
  do {
    if (lVar4 == 0x248) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
      goto LAB_0029e575;
    }
    bVar1 = std::operator==(&local_40,*(char **)((long)kReservedNames + lVar4));
    lVar4 = lVar4 + 8;
  } while (!bVar1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"PB",&local_41);
LAB_0029e575:
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const string& classname) {
  string lower = classname;
  transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      return "PB";
    }
  }

  return "";
}